

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O0

bool __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false>
::prune(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_false> *this)

{
  long *in_RDI;
  literals *this_00;
  BoundingBox<3> *extraout_XMM0_Qa;
  Real RVar1;
  double dVar2;
  bool uniform_sign;
  Real phi_0;
  int dim;
  Real dphi_max;
  GpuArray<double,_3U> mid;
  int i;
  PsiCode<3> c;
  int local_1e4;
  int local_1d4;
  int in_stack_fffffffffffffe38;
  undefined3 uVar3;
  int in_stack_fffffffffffffe3c;
  BoundingBox<3> *in_stack_fffffffffffffe40;
  int local_19c;
  double local_198;
  double local_190 [3];
  int local_174;
  int local_164;
  long local_160;
  int local_154;
  long local_150;
  int local_144;
  long local_140;
  int local_134;
  long local_130;
  int local_124;
  long local_120;
  int local_114;
  long *local_110;
  int local_104;
  long local_100;
  int local_f4;
  long local_f0;
  byte *local_e8;
  byte *local_e0;
  int local_d4;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  undefined1 local_b1;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined4 local_9c;
  double *local_98;
  undefined4 local_8c;
  double *local_88;
  undefined4 local_7c;
  double *local_78;
  undefined4 local_6c;
  double *local_68;
  undefined4 local_5c;
  double *local_58;
  undefined4 local_4c;
  double *local_48;
  undefined4 local_3c;
  double *local_38;
  undefined4 local_2c;
  double *local_28;
  undefined4 local_1c;
  double *local_18;
  int local_c;
  long local_8;
  
  local_174 = 0;
  do {
    while( true ) {
      if ((int)in_RDI[3] <= local_174) {
        return true;
      }
      this_00 = (literals *)local_190;
      BoundingBox<3>::midpoint();
      local_198 = literals::operator____rt(this_00,(longdouble)0);
      for (local_19c = 0; local_19c < 3; local_19c = local_19c + 1) {
        local_110 = in_RDI + 2;
        local_114 = local_19c;
        if ((*(byte *)((long)local_110 + (long)local_19c) & 1) == 0) {
          this_00 = (literals *)((long)in_RDI + 0x1c);
          local_120 = (long)in_RDI + 0x13;
          local_124 = local_174;
          local_f0 = local_120 + local_174;
          local_f4 = local_19c;
          RVar1 = BoundingBox<3>::operator()
                            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                             in_stack_fffffffffffffe38);
          local_d4 = local_19c;
          local_190[local_19c] = RVar1;
          local_d0 = local_190;
        }
        else {
          local_100 = *in_RDI;
          local_104 = local_19c;
          local_8 = local_100 + 0x18;
          local_c = local_19c;
          std::abs((int)this_00);
          local_198 = (double)extraout_XMM0_Qa + local_198;
          in_stack_fffffffffffffe40 = extraout_XMM0_Qa;
        }
      }
      local_c0 = (double *)*in_RDI;
      local_c8 = local_190;
      local_1c = 0;
      local_2c = 0;
      local_38 = local_c0 + 3;
      local_3c = 0;
      local_4c = 1;
      local_5c = 1;
      local_68 = local_c0 + 3;
      local_6c = 1;
      local_7c = 2;
      local_8c = 2;
      local_98 = local_c0 + 3;
      local_9c = 2;
      dVar2 = (local_190[2] - local_c0[2]) * local_c0[5] +
              (local_190[0] - *local_c0) * *local_38 + (local_190[1] - local_c0[1]) * local_c0[4];
      uVar3 = (undefined3)in_stack_fffffffffffffe3c;
      in_stack_fffffffffffffe3c = CONCAT13(1,uVar3);
      if (dVar2 <= local_198 * 0.4999999999999989) {
        in_stack_fffffffffffffe3c = CONCAT13(dVar2 < -(local_198 * 0.4999999999999989),uVar3);
      }
      local_88 = local_c0;
      local_78 = local_c8;
      local_58 = local_c0;
      local_48 = local_c8;
      local_28 = local_c0;
      local_18 = local_c8;
      if ((char)((uint)in_stack_fffffffffffffe3c >> 0x18) != '\0') break;
      local_174 = local_174 + 1;
    }
    if (dVar2 < 0.0) {
LAB_0164fd83:
      if (0.0 < dVar2) {
        return false;
      }
      local_140 = (long)in_RDI + 0x13;
      local_144 = local_174;
      local_e8 = (byte *)(local_140 + local_174);
      if ((*local_e8 & 8) == 0) {
        local_1e4 = -1;
        if ((*local_e8 & 0x10) != 0) {
          local_1e4 = 1;
        }
      }
      else {
        local_1e4 = 0;
      }
      if (0 < local_1e4) {
        return false;
      }
    }
    else {
      local_130 = (long)in_RDI + 0x13;
      local_134 = local_174;
      local_e0 = (byte *)(local_130 + local_174);
      if ((*local_e0 & 8) == 0) {
        local_1d4 = -1;
        if ((*local_e0 & 0x10) != 0) {
          local_1d4 = 1;
        }
      }
      else {
        local_1d4 = 0;
      }
      if (local_1d4 < 0) goto LAB_0164fd83;
    }
    *(int *)(in_RDI + 3) = (int)in_RDI[3] + -1;
    local_150 = (long)in_RDI + 0x13;
    local_154 = local_174;
    local_a8 = (undefined1 *)(local_150 + local_174);
    local_160 = (long)in_RDI + 0x13;
    local_164 = (int)in_RDI[3];
    local_b0 = (undefined1 *)(local_160 + local_164);
    local_b1 = *local_a8;
    *local_a8 = *local_b0;
    *local_b0 = local_b1;
  } while( true );
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool prune () noexcept
    {
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        static constexpr Real almostone = 1.0-10.*eps;

        for (int i = 0; i < psiCount; )
        {
            GpuArray<Real,N> mid = xrange.midpoint();
            Real dphi_max = 0.0_rt;
            for (int dim = 0; dim < N; ++dim) {
                if (free[dim]) {
                    dphi_max += amrex::Math::abs(phi.grad(dim));
                } else {
                    mid[dim] = xrange(psi[i].side(dim),dim);
                }
            }
            dphi_max *= 0.5*almostone;
            const Real phi_0 = phi(mid);
            bool uniform_sign = (phi_0 > dphi_max) || (phi_0 < -dphi_max);
            if (uniform_sign)
            {
                if ((phi_0 >= 0.0 && psi[i].sign() >= 0) ||
                    (phi_0 <= 0.0 && psi[i].sign() <= 0) )
                {
                    --psiCount;
                    detail::swap(psi[i], psi[psiCount]);
                }
                else {
                    return false;
                }
            }
            else {
                ++i;
            }
        }
        return true;
    }